

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int xmlidDocTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  undefined8 uVar2;
  char *__filename;
  char *err_00;
  int iVar3;
  char *result_00;
  char *filename_00;
  
  uVar2 = xmlNewParserCtxt();
  xmlCtxtSetErrorHandler(uVar2,testStructuredErrorHandler,0);
  xpathDocument = (xmlDocPtr)xmlCtxtReadFile(uVar2,filename,0);
  xmlFreeParserCtxt(uVar2);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
  }
  else {
    result_00 = temp_directory;
    filename_00 = filename;
    __filename = resultFilename(filename,temp_directory,".res");
    if (__filename == (char *)0x0) {
      xmlidDocTest_cold_2();
      iVar3 = uriCommonTest(filename_00,result_00,err_00,(char *)0x0);
      return iVar3;
    }
    xpathOutput = (FILE *)fopen64(__filename,"wb");
    if ((FILE *)xpathOutput != (FILE *)0x0) {
      iVar3 = 0;
      testXPath("id(\'bar\')",0,0);
      fclose((FILE *)xpathOutput);
      if ((result != (char *)0x0) && (iVar1 = compareFiles(__filename,result), iVar1 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
        iVar3 = 1;
      }
      unlink(__filename);
      free(__filename);
      xmlFreeDoc(xpathDocument);
      if (err == (char *)0x0) {
        return iVar3;
      }
      iVar1 = compareFileMem(err,testErrors,testErrorsSize);
      if (iVar1 == 0) {
        return iVar3;
      }
      fprintf(_stderr,"Error for %s failed\n",filename);
      return 1;
    }
    xmlidDocTest_cold_1();
  }
  return -1;
}

Assistant:

static int
xmlidDocTest(const char *filename,
             const char *result,
             const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    int res = 0;
    int ret = 0;
    char *temp;

    ctxt = xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xpathDocument = xmlCtxtReadFile(ctxt, filename, NULL,
            options | XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    xmlFreeParserCtxt(ctxt);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        xmlFreeDoc(xpathDocument);
        free(temp);
	return(-1);
    }

    testXPath("id('bar')", 0, 0);

    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    res = 1;
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    xmlFreeDoc(xpathDocument);

    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    res = 1;
	}
    }
    return(res);
}